

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O3

void helper_atomic_sto_be_mmu_sparc
               (CPUArchState_conflict16 *env,target_ulong_conflict addr,Int128 val,TCGMemOpIdx oi,
               uintptr_t retaddr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 (*pauVar3) [16];
  undefined8 uVar4;
  undefined4 in_register_00000014;
  undefined8 uVar5;
  TCGMemOpIdx in_R8D;
  uintptr_t in_R9;
  
  pauVar3 = (undefined1 (*) [16])atomic_mmu_lookup(env,addr,in_R8D,in_R9);
  uVar4 = *(undefined8 *)*pauVar3;
  uVar5 = *(undefined8 *)(*pauVar3 + 8);
  do {
    LOCK();
    auVar1 = *pauVar3;
    auVar2._8_8_ = uVar5;
    auVar2._0_8_ = uVar4;
    if (auVar2 == auVar1) {
      *(ulong *)*pauVar3 = CONCAT44(in_register_00000014,oi);
      *(uintptr_t *)(*pauVar3 + 8) = retaddr;
    }
    else {
      uVar5 = auVar1._8_8_;
      uVar4 = auVar1._0_8_;
    }
    UNLOCK();
  } while (auVar2 != auVar1);
  return;
}

Assistant:

void ATOMIC_NAME(st)(CPUArchState *env, target_ulong addr,
                     ABI_TYPE val EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;

    val = BSWAP(val);
    val = BSWAP(val);
    atomic16_set(haddr, val);
    ATOMIC_MMU_CLEANUP;
}